

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourcePosition.c
# Opt level: O3

void sysbvm_sourcePosition_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).sourcePositionType,"hash",1,0x90,(void *)0x0,
             sysbvm_sourcePosition_primitive_hash);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).sourcePositionType,"=",2,0x90,(void *)0x0,
             sysbvm_sourcePosition_primitive_equals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).sourcePositionType,"startLine",1,0x10,(void *)0x0,
             sysbvm_sourcePosition_primitive_startLine);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).sourcePositionType,"startColumn",1,0x10,(void *)0x0,
             sysbvm_sourcePosition_primitive_startColumn);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).sourcePositionType,"endLine",1,0x10,(void *)0x0,
             sysbvm_sourcePosition_primitive_endLine);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).sourcePositionType,"endColumn",1,0x10,(void *)0x0,
             sysbvm_sourcePosition_primitive_endColumn);
  return;
}

Assistant:

void sysbvm_sourcePosition_setupPrimitives(sysbvm_context_t *context)
{
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.sourcePositionType, "hash", 1, SYSBVM_FUNCTION_FLAGS_OVERRIDE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_sourcePosition_primitive_hash);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.sourcePositionType, "=", 2, SYSBVM_FUNCTION_FLAGS_OVERRIDE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_sourcePosition_primitive_equals);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.sourcePositionType, "startLine", 1, SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_sourcePosition_primitive_startLine);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.sourcePositionType, "startColumn", 1, SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_sourcePosition_primitive_startColumn);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.sourcePositionType, "endLine", 1, SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_sourcePosition_primitive_endLine);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.sourcePositionType, "endColumn", 1, SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_sourcePosition_primitive_endColumn);
}